

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_miniz.h
# Opt level: O1

tinfl_status
tinfl_decompress(tinfl_decompressor *r,mz_uint8 *pIn_buf_next,size_t *pIn_buf_size,
                mz_uint8 *pOut_buf_start,mz_uint8 *pOut_buf_next,size_t *pOut_buf_size,
                mz_uint32 decomp_flags)

{
  uint *puVar1;
  int *piVar2;
  ushort uVar3;
  short sVar4;
  mz_uint32 mVar5;
  tinfl_huff_table *ptVar6;
  char cVar7;
  byte bVar8;
  uint uVar9;
  ulong uVar10;
  mz_uint8 *pmVar11;
  uint uVar12;
  mz_uint8 *pmVar13;
  mz_uint8 *pmVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  long lVar29;
  uint uVar30;
  size_t sVar31;
  char cVar32;
  ulong uVar33;
  size_t buf_len;
  mz_uint8 *pmVar34;
  mz_uint8 *pmVar35;
  mz_int16 *__s;
  bool bVar36;
  mz_uint total_syms [16];
  mz_uint next_code [17];
  tinfl_status local_134;
  size_t local_130;
  uint local_128;
  uint local_114;
  uint *local_108;
  ulong local_100;
  ulong local_f8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  uint auStack_70 [16];
  
  if (pOut_buf_next < pOut_buf_start) {
LAB_00117dd6:
    *pOut_buf_size = 0;
    *pIn_buf_size = 0;
    return TINFL_STATUS_BAD_PARAM;
  }
  pmVar13 = pOut_buf_next + *pOut_buf_size;
  uVar22 = -(ulong)((decomp_flags & 4) != 0) | (ulong)(pmVar13 + ~(ulong)pOut_buf_start);
  if ((uVar22 + 1 & uVar22) != 0) goto LAB_00117dd6;
  uVar12 = r->m_state;
  local_128 = r->m_num_bits;
  local_f8 = r->m_bit_buf;
  uVar15 = r->m_dist;
  local_100 = (ulong)uVar15;
  uVar30 = r->m_counter;
  uVar10 = (ulong)uVar30;
  local_114 = r->m_num_extra;
  local_130 = r->m_dist_from_out_buf_start;
  cVar7 = '\0';
  local_108 = (uint *)pIn_buf_next;
  pmVar35 = pOut_buf_next;
  if (0x35 < uVar12) {
LAB_00118394:
    local_134 = TINFL_STATUS_FAILED;
    cVar32 = '\0';
    goto LAB_001185e9;
  }
  sVar31 = *pIn_buf_size;
  puVar1 = (uint *)(pIn_buf_next + sVar31);
  switch(uVar12) {
  case 0:
    r->m_zhdr1 = 0;
    r->m_z_adler32 = 1;
    r->m_zhdr0 = 0;
    r->m_check_adler32 = 1;
    if ((decomp_flags & 1) != 0) {
      if ((long)sVar31 < 1) {
        local_f8 = 0;
        local_114 = 0;
        uVar30 = 0;
        local_100 = 0;
        local_128 = 0;
        goto LAB_00118474;
      }
      local_108 = (uint *)(pIn_buf_next + 1);
      r->m_zhdr0 = (uint)*pIn_buf_next;
      local_f8 = 0;
      local_114 = 0;
      uVar30 = 0;
      local_100 = 0;
      local_128 = 0;
      goto LAB_00118488;
    }
    local_f8 = 0;
    local_114 = 0;
    uVar10 = 0;
    local_100 = 0;
    local_128 = 0;
joined_r0x001188cf:
    do {
      for (; local_128 < 3; local_128 = local_128 + 8) {
        if (local_108 < puVar1) {
LAB_00117faa:
          uVar23 = (ulong)(byte)*local_108;
          local_108 = (uint *)((long)local_108 + 1);
        }
        else {
LAB_00118b2b:
          uVar15 = (uint)local_100;
          uVar30 = (uint)uVar10;
          uVar23 = 0;
          uVar33 = 0;
          if ((decomp_flags & 2) != 0) {
            local_134 = TINFL_STATUS_NEEDS_MORE_INPUT;
            uVar12 = 3;
            cVar7 = '\x01';
            goto LAB_001185e6;
          }
        }
        local_f8 = local_f8 | uVar23 << ((byte)local_128 & 0x3f);
      }
      local_134 = TINFL_STATUS_FAILED;
      uVar30 = (uint)uVar10;
      uVar12 = (uint)local_f8 & 7;
      r->m_final = uVar12;
      local_f8 = local_f8 >> 3;
      local_128 = local_128 - 3;
      uVar15 = uVar12 >> 1;
      r->m_type = uVar15;
      if (1 < uVar12) {
        if (uVar15 == 1) {
          r->m_table_sizes[0] = 0x120;
          r->m_table_sizes[1] = 0x20;
          r->m_tables[1].m_code_size[0] = '\x05';
          r->m_tables[1].m_code_size[1] = '\x05';
          r->m_tables[1].m_code_size[2] = '\x05';
          r->m_tables[1].m_code_size[3] = '\x05';
          r->m_tables[1].m_code_size[4] = '\x05';
          r->m_tables[1].m_code_size[5] = '\x05';
          r->m_tables[1].m_code_size[6] = '\x05';
          r->m_tables[1].m_code_size[7] = '\x05';
          ptVar6 = r->m_tables;
          ptVar6[1].m_code_size[8] = '\x05';
          ptVar6[1].m_code_size[9] = '\x05';
          ptVar6[1].m_code_size[10] = '\x05';
          ptVar6[1].m_code_size[0xb] = '\x05';
          ptVar6[1].m_code_size[0xc] = '\x05';
          ptVar6[1].m_code_size[0xd] = '\x05';
          ptVar6[1].m_code_size[0xe] = '\x05';
          ptVar6[1].m_code_size[0xf] = '\x05';
          ptVar6 = r->m_tables;
          ptVar6[1].m_code_size[0x10] = '\x05';
          ptVar6[1].m_code_size[0x11] = '\x05';
          ptVar6[1].m_code_size[0x12] = '\x05';
          ptVar6[1].m_code_size[0x13] = '\x05';
          ptVar6[1].m_code_size[0x14] = '\x05';
          ptVar6[1].m_code_size[0x15] = '\x05';
          ptVar6[1].m_code_size[0x16] = '\x05';
          ptVar6[1].m_code_size[0x17] = '\x05';
          ptVar6 = r->m_tables;
          ptVar6[1].m_code_size[0x18] = '\x05';
          ptVar6[1].m_code_size[0x19] = '\x05';
          ptVar6[1].m_code_size[0x1a] = '\x05';
          ptVar6[1].m_code_size[0x1b] = '\x05';
          ptVar6[1].m_code_size[0x1c] = '\x05';
          ptVar6[1].m_code_size[0x1d] = '\x05';
          ptVar6[1].m_code_size[0x1e] = '\x05';
          ptVar6[1].m_code_size[0x1f] = '\x05';
          memset(r->m_tables,8,0x90);
          r->m_tables[0].m_code_size[0x90] = '\t';
          r->m_tables[0].m_code_size[0x91] = '\t';
          r->m_tables[0].m_code_size[0x92] = '\t';
          r->m_tables[0].m_code_size[0x93] = '\t';
          r->m_tables[0].m_code_size[0x94] = '\t';
          r->m_tables[0].m_code_size[0x95] = '\t';
          r->m_tables[0].m_code_size[0x96] = '\t';
          r->m_tables[0].m_code_size[0x97] = '\t';
          r->m_tables[0].m_code_size[0x98] = '\t';
          r->m_tables[0].m_code_size[0x99] = '\t';
          r->m_tables[0].m_code_size[0x9a] = '\t';
          r->m_tables[0].m_code_size[0x9b] = '\t';
          r->m_tables[0].m_code_size[0x9c] = '\t';
          r->m_tables[0].m_code_size[0x9d] = '\t';
          r->m_tables[0].m_code_size[0x9e] = '\t';
          r->m_tables[0].m_code_size[0x9f] = '\t';
          r->m_tables[0].m_code_size[0xa0] = '\t';
          r->m_tables[0].m_code_size[0xa1] = '\t';
          r->m_tables[0].m_code_size[0xa2] = '\t';
          r->m_tables[0].m_code_size[0xa3] = '\t';
          r->m_tables[0].m_code_size[0xa4] = '\t';
          r->m_tables[0].m_code_size[0xa5] = '\t';
          r->m_tables[0].m_code_size[0xa6] = '\t';
          r->m_tables[0].m_code_size[0xa7] = '\t';
          r->m_tables[0].m_code_size[0xa8] = '\t';
          r->m_tables[0].m_code_size[0xa9] = '\t';
          r->m_tables[0].m_code_size[0xaa] = '\t';
          r->m_tables[0].m_code_size[0xab] = '\t';
          r->m_tables[0].m_code_size[0xac] = '\t';
          r->m_tables[0].m_code_size[0xad] = '\t';
          r->m_tables[0].m_code_size[0xae] = '\t';
          r->m_tables[0].m_code_size[0xaf] = '\t';
          r->m_tables[0].m_code_size[0xb0] = '\t';
          r->m_tables[0].m_code_size[0xb1] = '\t';
          r->m_tables[0].m_code_size[0xb2] = '\t';
          r->m_tables[0].m_code_size[0xb3] = '\t';
          r->m_tables[0].m_code_size[0xb4] = '\t';
          r->m_tables[0].m_code_size[0xb5] = '\t';
          r->m_tables[0].m_code_size[0xb6] = '\t';
          r->m_tables[0].m_code_size[0xb7] = '\t';
          r->m_tables[0].m_code_size[0xb8] = '\t';
          r->m_tables[0].m_code_size[0xb9] = '\t';
          r->m_tables[0].m_code_size[0xba] = '\t';
          r->m_tables[0].m_code_size[0xbb] = '\t';
          r->m_tables[0].m_code_size[0xbc] = '\t';
          r->m_tables[0].m_code_size[0xbd] = '\t';
          r->m_tables[0].m_code_size[0xbe] = '\t';
          r->m_tables[0].m_code_size[0xbf] = '\t';
          r->m_tables[0].m_code_size[0xc0] = '\t';
          r->m_tables[0].m_code_size[0xc1] = '\t';
          r->m_tables[0].m_code_size[0xc2] = '\t';
          r->m_tables[0].m_code_size[0xc3] = '\t';
          r->m_tables[0].m_code_size[0xc4] = '\t';
          r->m_tables[0].m_code_size[0xc5] = '\t';
          r->m_tables[0].m_code_size[0xc6] = '\t';
          r->m_tables[0].m_code_size[199] = '\t';
          r->m_tables[0].m_code_size[200] = '\t';
          r->m_tables[0].m_code_size[0xc9] = '\t';
          r->m_tables[0].m_code_size[0xca] = '\t';
          r->m_tables[0].m_code_size[0xcb] = '\t';
          r->m_tables[0].m_code_size[0xcc] = '\t';
          r->m_tables[0].m_code_size[0xcd] = '\t';
          r->m_tables[0].m_code_size[0xce] = '\t';
          r->m_tables[0].m_code_size[0xcf] = '\t';
          r->m_tables[0].m_code_size[0xd0] = '\t';
          r->m_tables[0].m_code_size[0xd1] = '\t';
          r->m_tables[0].m_code_size[0xd2] = '\t';
          r->m_tables[0].m_code_size[0xd3] = '\t';
          r->m_tables[0].m_code_size[0xd4] = '\t';
          r->m_tables[0].m_code_size[0xd5] = '\t';
          r->m_tables[0].m_code_size[0xd6] = '\t';
          r->m_tables[0].m_code_size[0xd7] = '\t';
          r->m_tables[0].m_code_size[0xd8] = '\t';
          r->m_tables[0].m_code_size[0xd9] = '\t';
          r->m_tables[0].m_code_size[0xda] = '\t';
          r->m_tables[0].m_code_size[0xdb] = '\t';
          r->m_tables[0].m_code_size[0xdc] = '\t';
          r->m_tables[0].m_code_size[0xdd] = '\t';
          r->m_tables[0].m_code_size[0xde] = '\t';
          r->m_tables[0].m_code_size[0xdf] = '\t';
          r->m_tables[0].m_code_size[0xe0] = '\t';
          r->m_tables[0].m_code_size[0xe1] = '\t';
          r->m_tables[0].m_code_size[0xe2] = '\t';
          r->m_tables[0].m_code_size[0xe3] = '\t';
          r->m_tables[0].m_code_size[0xe4] = '\t';
          r->m_tables[0].m_code_size[0xe5] = '\t';
          r->m_tables[0].m_code_size[0xe6] = '\t';
          r->m_tables[0].m_code_size[0xe7] = '\t';
          r->m_tables[0].m_code_size[0xe8] = '\t';
          r->m_tables[0].m_code_size[0xe9] = '\t';
          r->m_tables[0].m_code_size[0xea] = '\t';
          r->m_tables[0].m_code_size[0xeb] = '\t';
          r->m_tables[0].m_code_size[0xec] = '\t';
          r->m_tables[0].m_code_size[0xed] = '\t';
          r->m_tables[0].m_code_size[0xee] = '\t';
          r->m_tables[0].m_code_size[0xef] = '\t';
          r->m_tables[0].m_code_size[0xf0] = '\t';
          r->m_tables[0].m_code_size[0xf1] = '\t';
          r->m_tables[0].m_code_size[0xf2] = '\t';
          r->m_tables[0].m_code_size[0xf3] = '\t';
          r->m_tables[0].m_code_size[0xf4] = '\t';
          r->m_tables[0].m_code_size[0xf5] = '\t';
          r->m_tables[0].m_code_size[0xf6] = '\t';
          r->m_tables[0].m_code_size[0xf7] = '\t';
          r->m_tables[0].m_code_size[0xf8] = '\t';
          r->m_tables[0].m_code_size[0xf9] = '\t';
          r->m_tables[0].m_code_size[0xfa] = '\t';
          r->m_tables[0].m_code_size[0xfb] = '\t';
          r->m_tables[0].m_code_size[0xfc] = '\t';
          r->m_tables[0].m_code_size[0xfd] = '\t';
          r->m_tables[0].m_code_size[0xfe] = '\t';
          r->m_tables[0].m_code_size[0xff] = '\t';
          r->m_tables[0].m_code_size[0x100] = '\a';
          r->m_tables[0].m_code_size[0x101] = '\a';
          r->m_tables[0].m_code_size[0x102] = '\a';
          r->m_tables[0].m_code_size[0x103] = '\a';
          r->m_tables[0].m_code_size[0x104] = '\a';
          r->m_tables[0].m_code_size[0x105] = '\a';
          r->m_tables[0].m_code_size[0x106] = '\a';
          r->m_tables[0].m_code_size[0x107] = '\a';
          r->m_tables[0].m_code_size[0x108] = '\a';
          r->m_tables[0].m_code_size[0x109] = '\a';
          r->m_tables[0].m_code_size[0x10a] = '\a';
          r->m_tables[0].m_code_size[0x10b] = '\a';
          r->m_tables[0].m_code_size[0x10c] = '\a';
          r->m_tables[0].m_code_size[0x10d] = '\a';
          r->m_tables[0].m_code_size[0x10e] = '\a';
          r->m_tables[0].m_code_size[0x10f] = '\a';
          r->m_tables[0].m_code_size[0x110] = '\a';
          r->m_tables[0].m_code_size[0x111] = '\a';
          r->m_tables[0].m_code_size[0x112] = '\a';
          r->m_tables[0].m_code_size[0x113] = '\a';
          r->m_tables[0].m_code_size[0x114] = '\a';
          r->m_tables[0].m_code_size[0x115] = '\a';
          r->m_tables[0].m_code_size[0x116] = '\a';
          r->m_tables[0].m_code_size[0x117] = '\a';
          r->m_tables[0].m_code_size[0x118] = '\b';
          r->m_tables[0].m_code_size[0x119] = '\b';
          r->m_tables[0].m_code_size[0x11a] = '\b';
          r->m_tables[0].m_code_size[0x11b] = '\b';
          r->m_tables[0].m_code_size[0x11c] = '\b';
          r->m_tables[0].m_code_size[0x11d] = '\b';
          r->m_tables[0].m_code_size[0x11e] = '\b';
          r->m_tables[0].m_code_size[0x11f] = '\b';
LAB_00118dde:
          while( true ) {
            mVar5 = r->m_type;
            lVar29 = (long)(int)mVar5;
            if (lVar29 < 0) break;
            local_88 = 0;
            uStack_80 = 0;
            local_98 = 0;
            uStack_90 = 0;
            local_a8 = 0;
            uStack_a0 = 0;
            local_b8 = 0;
            uStack_b0 = 0;
            __s = r->m_tables[lVar29].m_look_up;
            uVar12 = 0;
            memset(__s,0,0xc80);
            uVar33 = (ulong)r->m_table_sizes[lVar29];
            if (uVar33 != 0) {
              uVar23 = 0;
              do {
                piVar2 = (int *)((long)&local_b8 +
                                (ulong)r->m_tables[lVar29].m_code_size[uVar23] * 4);
                *piVar2 = *piVar2 + 1;
                uVar23 = uVar23 + 1;
              } while (uVar33 != uVar23);
            }
            local_78 = 0;
            lVar24 = 0;
            uVar15 = 0;
            do {
              iVar16 = *(int *)((long)&local_b8 + (lVar24 + 1) * 4);
              uVar15 = uVar15 + iVar16;
              uVar12 = (uVar12 + iVar16) * 2;
              auStack_70[lVar24] = uVar12;
              lVar24 = lVar24 + 1;
            } while (lVar24 != 0xf);
            if (uVar12 != 0x10000 && 1 < uVar15) {
              uVar12 = 0x23;
LAB_001191f6:
              local_134 = TINFL_STATUS_FAILED;
              uVar33 = 0;
              uVar30 = (uint)uVar10;
              cVar7 = '\0';
              uVar15 = (uint)local_100;
              goto LAB_001185e6;
            }
            if (uVar33 != 0) {
              uVar12 = 0xffffffff;
              uVar23 = 0;
              do {
                bVar8 = r->m_tables[lVar29].m_code_size[uVar23];
                uVar20 = (ulong)bVar8;
                if (bVar8 != 0) {
                  uVar30 = auStack_70[uVar20 - 2];
                  auStack_70[uVar20 - 2] = uVar30 + 1;
                  uVar15 = 0;
                  uVar9 = (uint)bVar8;
                  do {
                    uVar19 = uVar15;
                    uVar21 = uVar30 & 1;
                    uVar15 = uVar21 + uVar19 * 2;
                    uVar30 = uVar30 >> 1;
                    uVar9 = uVar9 - 1;
                  } while (uVar9 != 0);
                  uVar19 = uVar19 * 2;
                  if (bVar8 < 0xb) {
                    if (uVar19 < 0x400) {
                      uVar20 = (ulong)(uVar19 | uVar21);
                      do {
                        __s[uVar20] = (ushort)uVar23 | (ushort)bVar8 << 9;
                        uVar20 = uVar20 + (1L << (bVar8 & 0x3f));
                      } while (uVar20 < 0x400);
                    }
                  }
                  else {
                    uVar15 = uVar15 & 0x3ff;
                    uVar30 = (uint)__s[uVar15];
                    if (__s[uVar15] == 0) {
                      __s[uVar15] = (mz_int16)uVar12;
                      uVar30 = uVar12;
                      uVar12 = uVar12 - 2;
                    }
                    uVar19 = uVar19 >> 9;
                    if (bVar8 != 0xb) {
                      do {
                        iVar16 = ~uVar30 + (uint)((uVar19 >> 1 & 1) != 0);
                        sVar4 = r->m_tables[lVar29].m_tree[iVar16];
                        uVar30 = (uint)sVar4;
                        if (sVar4 == 0) {
                          r->m_tables[lVar29].m_tree[iVar16] = (mz_int16)uVar12;
                          uVar30 = uVar12;
                          uVar12 = uVar12 - 2;
                        }
                        uVar19 = uVar19 >> 1;
                        uVar15 = (int)uVar20 - 1;
                        uVar20 = (ulong)uVar15;
                      } while (0xb < uVar15);
                    }
                    r->m_tables[lVar29].m_tree[(int)(~uVar30 + (uint)((uVar19 >> 1 & 1) != 0))] =
                         (ushort)uVar23;
                  }
                }
                uVar23 = uVar23 + 1;
              } while (uVar23 != uVar33);
            }
            uVar33 = 0;
            if (mVar5 == 2) {
              while( true ) {
                uVar10 = uVar33;
                uVar12 = r->m_table_sizes[0];
                uVar15 = r->m_table_sizes[1];
                uVar30 = uVar12 + uVar15;
                if (uVar30 <= (uint)uVar10) break;
                if (local_128 < 0xf) {
                  if ((long)puVar1 - (long)local_108 < 2) {
                    do {
                      uVar3 = r->m_tables[2].m_look_up[(uint)local_f8 & 0x3ff];
                      uVar12 = (uint)(short)uVar3;
                      if ((short)uVar3 < 0) {
                        if (10 < local_128) {
                          uVar15 = 0xc;
                          do {
                            sVar4 = r->m_tables[2].m_tree
                                    [(long)(int)~uVar12 +
                                     (ulong)((local_f8 >> ((ulong)(uVar15 - 2) & 0x3f) & 1) != 0)];
                            uVar12 = (uint)sVar4;
                            if (-1 < sVar4) break;
                            bVar36 = uVar15 <= local_128;
                            uVar15 = uVar15 + 1;
                          } while (bVar36);
                          if (-1 < sVar4) break;
                        }
                      }
                      else if ((0x1ff < uVar3) && (uVar12 >> 9 <= local_128)) break;
                      if (local_108 < puVar1) {
LAB_001180d0:
                        uVar23 = (ulong)(byte)*local_108;
                        local_108 = (uint *)((long)local_108 + 1);
                      }
                      else {
LAB_001187ee:
                        uVar30 = (uint)uVar10;
                        uVar23 = 0;
                        uVar33 = 0;
                        if ((decomp_flags & 2) != 0) {
                          local_134 = TINFL_STATUS_NEEDS_MORE_INPUT;
                          uVar12 = 0x10;
                          cVar7 = '\x01';
                          uVar15 = (uint)local_100;
                          goto LAB_001185e6;
                        }
                      }
                      local_f8 = local_f8 | uVar23 << ((byte)local_128 & 0x3f);
                      local_128 = local_128 + 8;
                    } while (local_128 < 0xf);
                  }
                  else {
                    local_f8 = local_f8 |
                               (ulong)*(byte *)((long)local_108 + 1) << ((byte)local_128 + 8 & 0x3f)
                               | (ulong)(byte)*local_108 << ((byte)local_128 & 0x3f);
                    local_108 = (uint *)((long)local_108 + 2);
                    local_128 = local_128 | 0x10;
                  }
                }
                uVar12 = (uint)r->m_tables[2].m_look_up[(uint)local_f8 & 0x3ff];
                local_100 = (ulong)uVar12;
                if ((int)uVar12 < 0) {
                  uVar33 = 10;
                  do {
                    uVar15 = (int)uVar33 + 1;
                    uVar12 = (uint)r->m_tables[2].m_tree
                                   [(long)(int)~(uint)local_100 +
                                    (ulong)((local_f8 >> (uVar33 & 0x3f) & 1) != 0)];
                    local_100 = (ulong)uVar12;
                    uVar33 = (ulong)uVar15;
                  } while ((int)uVar12 < 0);
                }
                else {
                  uVar15 = uVar12 >> 9;
                  local_100 = (ulong)(uVar12 & 0x1ff);
                }
                local_f8 = local_f8 >> ((byte)uVar15 & 0x3f);
                local_128 = local_128 - uVar15;
                uVar12 = (uint)local_100;
                if (uVar12 < 0x10) {
                  r->m_len_codes[uVar10] = (mz_uint8)local_100;
                  uVar33 = (ulong)((int)uVar10 + 1);
                }
                else {
                  if ((uVar12 == 0x10) && ((int)uVar10 == 0)) {
                    uVar30 = 0;
                    local_100 = 0x10;
                    uVar12 = 0x11;
                    goto LAB_00118baa;
                  }
                  local_114 = (uint)"\x02\x03\a"[uVar12 - 0x10];
                  for (; uVar30 = (uint)uVar10, local_128 < local_114; local_128 = local_128 + 8) {
                    if (local_108 < puVar1) {
LAB_001182a1:
                      uVar10 = (ulong)(byte)*local_108;
                      local_108 = (uint *)((long)local_108 + 1);
                    }
                    else {
LAB_00119513:
                      uVar10 = 0;
                      uVar33 = 0;
                      if ((decomp_flags & 2) != 0) {
                        local_134 = TINFL_STATUS_NEEDS_MORE_INPUT;
                        uVar12 = 0x12;
                        cVar7 = '\x01';
                        uVar15 = (uint)local_100;
                        goto LAB_001185e6;
                      }
                    }
                    local_f8 = local_f8 | uVar10 << ((byte)local_128 & 0x3f);
                    uVar10 = (ulong)uVar30;
                  }
                  uVar12 = (uint)local_f8;
                  local_f8 = local_f8 >> ((byte)local_114 & 0x3f);
                  local_128 = local_128 - local_114;
                  uVar12 = (int)"\x03\x03\v"[(int)local_100 - 0x10] +
                           (uVar12 & ~(-1 << ((byte)local_114 & 0x1f)));
                  bVar8 = 0;
                  if ((int)local_100 == 0x10) {
                    bVar8 = r->m_len_codes[uVar30 - 1];
                  }
                  memset(r->m_len_codes + uVar10,(uint)bVar8,(ulong)uVar12);
                  uVar33 = (ulong)(uVar30 + uVar12);
                }
              }
              if ((uint)uVar10 != uVar30) {
                uVar12 = 0x15;
                goto LAB_001191f6;
              }
              memcpy(r->m_tables,r->m_len_codes,(ulong)uVar12);
              memcpy(r->m_tables + 1,r->m_len_codes + uVar12,(ulong)uVar15);
            }
            r->m_type = r->m_type - 1;
          }
LAB_00119200:
          do {
            bVar8 = (byte)local_128;
            if ((3 < (long)puVar1 - (long)local_108) && (1 < (long)pmVar13 - (long)pmVar35))
            goto code_r0x00119222;
            if (local_128 < 0xf) {
              if ((long)puVar1 - (long)local_108 < 2) {
                do {
                  uVar3 = r->m_tables[0].m_look_up[(uint)local_f8 & 0x3ff];
                  uVar12 = (uint)(short)uVar3;
                  if ((short)uVar3 < 0) {
                    if (10 < local_128) {
                      uVar15 = 0xc;
                      do {
                        sVar4 = r->m_tables[0].m_tree
                                [(long)(int)~uVar12 +
                                 (ulong)((local_f8 >> ((ulong)(uVar15 - 2) & 0x3f) & 1) != 0)];
                        uVar12 = (uint)sVar4;
                        if (-1 < sVar4) break;
                        bVar36 = uVar15 <= local_128;
                        uVar15 = uVar15 + 1;
                      } while (bVar36);
                      if (-1 < sVar4) break;
                    }
                  }
                  else if ((0x1ff < uVar3) && (uVar12 >> 9 <= local_128)) break;
                  if (local_108 < puVar1) {
LAB_00117ecc:
                    uVar23 = (ulong)(byte)*local_108;
                    local_108 = (uint *)((long)local_108 + 1);
                  }
                  else {
LAB_0011938e:
                    uVar15 = (uint)local_100;
                    uVar30 = (uint)uVar10;
                    uVar23 = 0;
                    uVar33 = 0;
                    if ((decomp_flags & 2) != 0) {
                      local_134 = TINFL_STATUS_NEEDS_MORE_INPUT;
                      uVar12 = 0x17;
                      cVar7 = '\x01';
                      goto LAB_001185e6;
                    }
                  }
                  local_f8 = local_f8 | uVar23 << ((byte)local_128 & 0x3f);
                  local_128 = local_128 + 8;
                } while (local_128 < 0xf);
              }
              else {
                local_f8 = local_f8 |
                           (ulong)*(byte *)((long)local_108 + 1) << (bVar8 + 8 & 0x3f) |
                           (ulong)(byte)*local_108 << (bVar8 & 0x3f);
                local_108 = (uint *)((long)local_108 + 2);
                local_128 = local_128 | 0x10;
              }
            }
            uVar12 = (uint)r->m_tables[0].m_look_up[(uint)local_f8 & 0x3ff];
            uVar10 = (ulong)uVar12;
            if ((int)uVar12 < 0) {
              uVar33 = 10;
              do {
                uVar15 = (int)uVar33 + 1;
                uVar12 = (uint)r->m_tables[0].m_tree
                               [(long)(int)~(uint)uVar10 +
                                (ulong)((local_f8 >> (uVar33 & 0x3f) & 1) != 0)];
                uVar10 = (ulong)uVar12;
                uVar33 = (ulong)uVar15;
              } while ((int)uVar12 < 0);
            }
            else {
              uVar15 = uVar12 >> 9;
              uVar10 = (ulong)(uVar12 & 0x1ff);
            }
            local_f8 = local_f8 >> ((byte)uVar15 & 0x3f);
            local_128 = local_128 - uVar15;
            uVar12 = (uint)uVar10;
            if (0xff < uVar12) goto LAB_00119401;
LAB_0011943f:
            uVar30 = (uint)uVar10;
            if (pmVar13 <= pmVar35) {
              local_134 = TINFL_STATUS_HAS_MORE_OUTPUT;
              uVar10 = 1;
              uVar12 = 0x18;
              goto LAB_00118bac;
            }
            *pmVar35 = (mz_uint8)uVar10;
            pmVar35 = pmVar35 + 1;
          } while( true );
        }
        uVar10 = 0;
        if (uVar15 != 3) {
          while (uVar12 = (uint)uVar10, uVar12 < 3) {
            if (local_128 < (uint)(int)"\x05\x05\x04"[uVar10]) {
              do {
                if (local_108 < puVar1) {
LAB_00117f6c:
                  uVar23 = (ulong)(byte)*local_108;
                  local_108 = (uint *)((long)local_108 + 1);
                }
                else {
LAB_00118b69:
                  uVar30 = (uint)uVar10;
                  uVar23 = 0;
                  uVar33 = 0;
                  if ((decomp_flags & 2) != 0) {
                    local_134 = TINFL_STATUS_NEEDS_MORE_INPUT;
                    uVar12 = 0xb;
                    cVar7 = '\x01';
                    uVar15 = (uint)local_100;
                    goto LAB_001185e6;
                  }
                }
                local_f8 = local_f8 | uVar23 << ((byte)local_128 & 0x3f);
                local_128 = local_128 + 8;
                uVar12 = (uint)uVar10;
              } while (local_128 < (uint)(int)"\x05\x05\x04"[uVar10]);
            }
            bVar8 = "\x05\x05\x04"[uVar12];
            local_128 = local_128 - (int)(char)bVar8;
            r->m_table_sizes[uVar12] =
                 ((uint)local_f8 & ~(-1 << (bVar8 & 0x1f))) +
                 tinfl_decompress::s_min_table_sizes[uVar12];
            local_f8 = local_f8 >> (bVar8 & 0x3f);
            uVar10 = (ulong)(uVar12 + 1);
          }
          memset(r->m_tables + 2,0,0x120);
          for (uVar10 = 0; (uint)uVar10 < r->m_table_sizes[2]; uVar10 = (ulong)((int)uVar10 + 1)) {
            for (; local_128 < 3; local_128 = local_128 + 8) {
              if (local_108 < puVar1) {
LAB_00117e8e:
                uVar23 = (ulong)(byte)*local_108;
                local_108 = (uint *)((long)local_108 + 1);
              }
              else {
LAB_00118daf:
                uVar30 = (uint)uVar10;
                uVar23 = 0;
                uVar33 = 0;
                if ((decomp_flags & 2) != 0) {
                  local_134 = TINFL_STATUS_NEEDS_MORE_INPUT;
                  uVar12 = 0xe;
                  cVar7 = '\x01';
                  uVar15 = (uint)local_100;
                  goto LAB_001185e6;
                }
              }
              local_f8 = local_f8 | uVar23 << ((byte)local_128 & 0x3f);
            }
            bVar8 = (byte)local_f8;
            local_f8 = local_f8 >> 3;
            local_128 = local_128 - 3;
            r->m_tables[2].m_code_size["\x10\x11\x12"[uVar10]] = bVar8 & 7;
          }
          r->m_table_sizes[2] = 0x13;
          goto LAB_00118dde;
        }
        uVar12 = 10;
LAB_00118bac:
        uVar33 = 0;
        cVar7 = (char)uVar10;
        uVar15 = (uint)local_100;
        goto LAB_001185e6;
      }
LAB_001188f1:
      local_f8 = local_f8 >> ((byte)local_128 & 7);
      local_128 = local_128 & 0xfffffff8;
      uVar10 = 0;
      while (uVar30 = (uint)uVar10, uVar30 < 4) {
        if (local_128 == 0) {
          local_128 = 0;
          if (local_108 < puVar1) {
            uVar12 = *local_108;
            local_108 = (uint *)((long)local_108 + 1);
            r->m_raw_header[uVar10] = (byte)uVar12;
            local_128 = 0;
          }
          else {
LAB_00118a4d:
            uVar30 = (uint)uVar10;
            if ((decomp_flags & 2) != 0) {
              local_134 = TINFL_STATUS_NEEDS_MORE_INPUT;
              uVar10 = 1;
              uVar12 = 7;
              goto LAB_00118bac;
            }
            r->m_raw_header[uVar10] = '\0';
          }
        }
        else {
          uVar12 = local_128;
          if (local_128 < 8) {
            do {
              if (local_108 < puVar1) {
LAB_00117f0a:
                uVar23 = (ulong)(byte)*local_108;
                local_108 = (uint *)((long)local_108 + 1);
              }
              else {
LAB_00118bbd:
                uVar30 = (uint)uVar10;
                uVar23 = 0;
                uVar33 = 0;
                if ((decomp_flags & 2) != 0) {
                  local_134 = TINFL_STATUS_NEEDS_MORE_INPUT;
                  uVar12 = 6;
                  cVar7 = '\x01';
                  uVar15 = (uint)local_100;
                  goto LAB_001185e6;
                }
              }
              local_f8 = local_f8 | uVar23 << ((byte)local_128 & 0x3f);
              uVar12 = local_128 + 8;
              bVar36 = 0xfffffff7 < local_128;
              local_128 = uVar12;
            } while (bVar36);
          }
          uVar30 = (uint)uVar10;
          r->m_raw_header[uVar10] = (mz_uint8)local_f8;
          local_f8 = local_f8 >> 8;
          local_128 = uVar12 - 8;
        }
LAB_00118a5d:
        uVar10 = (ulong)(uVar30 + 1);
      }
      uVar3 = *(ushort *)r->m_raw_header;
      uVar10 = (ulong)uVar3;
      uVar30 = (uint)uVar3;
      if ((*(ushort *)(r->m_raw_header + 2) ^ uVar3) != 0xffff) {
        uVar12 = 0x27;
LAB_00118baa:
        local_134 = TINFL_STATUS_FAILED;
        uVar10 = 0;
        goto LAB_00118bac;
      }
      while ((uVar30 = (uint)uVar10, uVar30 != 0 && (local_128 != 0))) {
        uVar12 = local_128;
        if (local_128 < 8) {
          do {
            if (local_108 < puVar1) {
LAB_0011831d:
              uVar23 = (ulong)(byte)*local_108;
              local_108 = (uint *)((long)local_108 + 1);
            }
            else {
LAB_00118d30:
              uVar30 = (uint)uVar10;
              uVar23 = 0;
              uVar33 = 0;
              if ((decomp_flags & 2) != 0) {
                local_134 = TINFL_STATUS_NEEDS_MORE_INPUT;
                uVar12 = 0x33;
                cVar7 = '\x01';
                uVar15 = (uint)local_100;
                goto LAB_001185e6;
              }
            }
            uVar30 = (uint)uVar10;
            local_f8 = local_f8 | uVar23 << ((byte)local_128 & 0x3f);
            uVar12 = local_128 + 8;
            bVar36 = 0xfffffff7 < local_128;
            local_128 = uVar12;
          } while (bVar36);
        }
        local_100 = local_f8 & 0xff;
        local_f8 = local_f8 >> 8;
        local_128 = uVar12 - 8;
LAB_00118c17:
        if (pmVar13 <= pmVar35) {
          local_134 = TINFL_STATUS_HAS_MORE_OUTPUT;
          uVar10 = 1;
          uVar12 = 0x34;
          goto LAB_00118bac;
        }
        *pmVar35 = (mz_uint8)local_100;
        pmVar35 = pmVar35 + 1;
        uVar10 = (ulong)(uVar30 - 1);
      }
      while ((int)uVar10 != 0) {
LAB_00118c58:
        uVar30 = (uint)uVar10;
        if (pmVar13 <= pmVar35) {
          local_134 = TINFL_STATUS_HAS_MORE_OUTPUT;
          uVar10 = 1;
          uVar12 = 9;
          goto LAB_00118bac;
        }
LAB_00118c6f:
        uVar30 = (uint)uVar10;
        if (puVar1 <= local_108) {
          if ((decomp_flags & 2) == 0) {
            uVar12 = 0x28;
            goto LAB_00118baa;
          }
          local_134 = TINFL_STATUS_NEEDS_MORE_INPUT;
          uVar10 = 1;
          uVar12 = 0x26;
          goto LAB_00118bac;
        }
        uVar33 = (long)puVar1 - (long)local_108;
        if ((ulong)((long)pmVar13 - (long)pmVar35) < (ulong)((long)puVar1 - (long)local_108)) {
          uVar33 = (long)pmVar13 - (long)pmVar35;
        }
        if (uVar10 <= uVar33) {
          uVar33 = uVar10;
        }
        memcpy(pmVar35,local_108,uVar33);
        local_108 = (uint *)((long)local_108 + uVar33);
        pmVar35 = pmVar35 + uVar33;
        uVar10 = (ulong)(uVar30 - (int)uVar33);
      }
      uVar10 = 0;
LAB_00119414:
      uVar15 = (uint)local_100;
      uVar30 = (uint)uVar10;
    } while ((r->m_final & 1) == 0);
    if ((decomp_flags & 1) != 0) goto LAB_001194c5;
    goto LAB_00119428;
  case 1:
    if ((long)sVar31 < 1) {
LAB_00118474:
      uVar15 = (uint)local_100;
      if ((decomp_flags & 2) != 0) {
        uVar12 = 1;
        goto LAB_001185dc;
      }
      r->m_zhdr0 = 0;
    }
    else {
      r->m_zhdr0 = (uint)*pIn_buf_next;
      local_108 = (uint *)(pIn_buf_next + 1);
    }
LAB_00118488:
    if (puVar1 <= local_108) goto LAB_00118491;
LAB_00117f29:
    uVar33 = (ulong)(byte)*local_108;
    local_108 = (uint *)((long)local_108 + 1);
LAB_001184a3:
    uVar15 = (uint)local_100;
    uVar12 = r->m_zhdr0;
    bVar36 = (uVar12 & 0xf) != 8 ||
             ((uVar33 & 0x20) != 0 || (uVar12 << 8 | (uint)uVar33) % 0x1f != 0);
    r->m_zhdr1 = (uint)uVar33;
    if ((decomp_flags & 4) == 0) {
      uVar10 = 0x100L << ((byte)(uVar12 >> 4) & 0x3f);
      bVar36 = bVar36 || (uVar22 + 1 < uVar10 || 0x8000 < (uint)uVar10);
    }
    local_134 = TINFL_STATUS_FAILED;
    uVar10 = 0;
    if (!bVar36) goto joined_r0x001188cf;
    uVar30 = 1;
    uVar12 = 0x24;
    uVar33 = 0;
    cVar7 = '\0';
    break;
  case 2:
    if (0 < (long)sVar31) goto LAB_00117f29;
LAB_00118491:
    uVar15 = (uint)local_100;
    uVar33 = 0;
    if ((decomp_flags & 2) == 0) goto LAB_001184a3;
    local_134 = TINFL_STATUS_NEEDS_MORE_INPUT;
    uVar12 = 2;
    cVar7 = '\x01';
    break;
  case 3:
    if ((long)sVar31 < 1) goto LAB_00118b2b;
    goto LAB_00117faa;
  default:
    goto LAB_00118394;
  case 5:
    if (0 < (long)sVar31) {
      uVar10 = (ulong)*pIn_buf_next;
      local_108 = (uint *)(pIn_buf_next + 1);
LAB_001183f0:
      local_f8 = local_f8 | uVar10 << ((byte)local_128 & 0x3f);
      local_128 = local_128 + 8;
      goto LAB_001188f1;
    }
    uVar10 = 0;
    if ((decomp_flags & 2) == 0) goto LAB_001183f0;
    uVar12 = 5;
LAB_001185dc:
    local_134 = TINFL_STATUS_NEEDS_MORE_INPUT;
    uVar33 = 0;
    cVar7 = '\x01';
    break;
  case 6:
    if ((long)sVar31 < 1) goto LAB_00118bbd;
    goto LAB_00117f0a;
  case 7:
    if ((long)sVar31 < 1) goto LAB_00118a4d;
    local_108 = (uint *)(pIn_buf_next + 1);
    r->m_raw_header[uVar10] = *pIn_buf_next;
    goto LAB_00118a5d;
  case 9:
    goto LAB_00118c58;
  case 10:
  case 0x11:
  case 0x15:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x27:
  case 0x28:
    local_134 = TINFL_STATUS_FAILED;
    uVar33 = 0;
    cVar7 = '\0';
    break;
  case 0xb:
    if ((long)sVar31 < 1) goto LAB_00118b69;
    goto LAB_00117f6c;
  case 0xe:
    if ((long)sVar31 < 1) goto LAB_00118daf;
    goto LAB_00117e8e;
  case 0x10:
    if ((long)sVar31 < 1) goto LAB_001187ee;
    goto LAB_001180d0;
  case 0x12:
    if ((long)sVar31 < 1) goto LAB_00119513;
    goto LAB_001182a1;
  case 0x17:
    if ((long)sVar31 < 1) goto LAB_0011938e;
    goto LAB_00117ecc;
  case 0x18:
    goto LAB_0011943f;
  case 0x19:
    if ((long)sVar31 < 1) goto LAB_0011888f;
    goto LAB_00118263;
  case 0x1a:
    if ((long)sVar31 < 1) goto LAB_00119637;
    goto LAB_001181c8;
  case 0x1b:
    if ((long)sVar31 < 1) goto LAB_001196f0;
    goto LAB_001182df;
  case 0x20:
    if ((long)sVar31 < 1) {
      uVar22 = 0;
      if ((decomp_flags & 2) != 0) {
        uVar12 = 0x20;
        goto LAB_001185dc;
      }
    }
    else {
      uVar22 = (ulong)*pIn_buf_next;
      local_108 = (uint *)(pIn_buf_next + 1);
    }
    local_f8 = local_f8 | uVar22 << ((byte)local_128 & 0x3f);
    local_128 = local_128 + 8;
LAB_001194c5:
    local_f8 = local_f8 >> ((byte)local_128 & 7);
    uVar10 = 0;
    uVar9 = local_128 & 0xfffffff8;
    while( true ) {
      uVar15 = (uint)local_100;
      uVar30 = (uint)uVar10;
      local_128 = uVar9;
      if (3 < uVar30) break;
      if (uVar9 == 0) {
        local_128 = 0;
        if (local_108 < puVar1) {
          uVar12 = (uint)(byte)*local_108;
          local_108 = (uint *)((long)local_108 + 1);
          local_128 = 0;
        }
        else {
LAB_00118852:
          uVar33 = 0;
          uVar12 = 0;
          if ((decomp_flags & 2) != 0) {
            local_134 = TINFL_STATUS_NEEDS_MORE_INPUT;
            uVar12 = 0x2a;
            cVar7 = '\x01';
            uVar15 = (uint)local_100;
            goto LAB_001185e6;
          }
        }
      }
      else {
        if (uVar9 < 8) {
          do {
            if (local_108 < puVar1) {
LAB_0011818a:
              uVar33 = (ulong)(byte)*local_108;
              local_108 = (uint *)((long)local_108 + 1);
            }
            else {
LAB_0011982b:
              uVar30 = (uint)uVar10;
              uVar33 = 0;
              if ((decomp_flags & 2) != 0) {
                local_134 = TINFL_STATUS_NEEDS_MORE_INPUT;
                uVar12 = 0x29;
                cVar7 = '\x01';
                uVar15 = (uint)local_100;
                goto LAB_001185e6;
              }
            }
            uVar30 = (uint)uVar10;
            local_f8 = local_f8 | uVar33 << ((byte)local_128 & 0x3f);
            uVar9 = local_128 + 8;
            bVar36 = 0xfffffff7 < local_128;
            local_128 = uVar9;
          } while (bVar36);
        }
        uVar12 = (uint)local_f8 & 0xff;
        local_f8 = local_f8 >> 8;
        local_128 = uVar9 - 8;
      }
LAB_0011880f:
      r->m_z_adler32 = r->m_z_adler32 << 8 | uVar12;
      uVar10 = (ulong)(uVar30 + 1);
      uVar9 = local_128;
    }
LAB_00119428:
    local_134 = TINFL_STATUS_DONE;
    uVar12 = 0x22;
    uVar33 = 1;
    cVar7 = '\x01';
    break;
  case 0x22:
    local_134 = TINFL_STATUS_DONE;
    cVar7 = '\x01';
    uVar33 = 1;
    break;
  case 0x26:
    goto LAB_00118c6f;
  case 0x29:
    if ((long)sVar31 < 1) goto LAB_0011982b;
    goto LAB_0011818a;
  case 0x2a:
    if ((long)sVar31 < 1) goto LAB_00118852;
    local_108 = (uint *)(pIn_buf_next + 1);
    uVar12 = (uint)*pIn_buf_next;
    goto LAB_0011880f;
  case 0x33:
    if ((long)sVar31 < 1) goto LAB_00118d30;
    goto LAB_0011831d;
  case 0x34:
    goto LAB_00118c17;
  case 0x35:
    sVar31 = local_130;
    goto LAB_00119807;
  }
LAB_001185e6:
  cVar32 = (char)uVar33;
  r->m_state = uVar12;
LAB_001185e9:
  r->m_num_bits = local_128;
  r->m_bit_buf = local_f8;
  r->m_dist = uVar15;
  r->m_counter = uVar30;
  r->m_num_extra = local_114;
  r->m_dist_from_out_buf_start = local_130;
  *pIn_buf_size = (long)local_108 - (long)pIn_buf_next;
  uVar22 = (long)pmVar35 - (long)pOut_buf_next;
  *pOut_buf_size = uVar22;
  if (cVar7 != '\0') {
    uVar15 = r->m_check_adler32 & 0xffff;
    uVar12 = r->m_check_adler32 >> 0x10;
    if (uVar22 != 0) {
      uVar10 = uVar22 % 0x15b0;
      do {
        uVar23 = 0;
        uVar33 = uVar23;
        if (7 < uVar10) {
          do {
            iVar25 = pOut_buf_next[uVar33] + uVar15;
            iVar16 = (uint)pOut_buf_next[uVar33 + 1] + iVar25;
            iVar26 = (uint)pOut_buf_next[uVar33 + 2] + iVar16;
            iVar17 = (uint)pOut_buf_next[uVar33 + 3] + iVar26;
            iVar27 = (uint)pOut_buf_next[uVar33 + 4] + iVar17;
            iVar18 = (uint)pOut_buf_next[uVar33 + 5] + iVar27;
            iVar28 = (uint)pOut_buf_next[uVar33 + 6] + iVar18;
            uVar15 = (uint)pOut_buf_next[uVar33 + 7] + iVar28;
            uVar12 = uVar12 + iVar25 + iVar16 + iVar26 + iVar17 + iVar27 + iVar18 + iVar28 + uVar15;
            uVar23 = uVar33 + 8;
            iVar16 = (int)uVar33;
            uVar33 = uVar23;
          } while (iVar16 + 0xfU < (uint)uVar10);
          pOut_buf_next = pOut_buf_next + uVar23;
        }
        lVar29 = uVar10 - uVar23;
        if (uVar23 <= uVar10 && lVar29 != 0) {
          lVar24 = 0;
          do {
            uVar15 = uVar15 + pOut_buf_next[lVar24];
            uVar12 = uVar12 + uVar15;
            lVar24 = lVar24 + 1;
          } while (lVar29 != lVar24);
          pOut_buf_next = pOut_buf_next + lVar29;
        }
        uVar15 = uVar15 % 0xfff1;
        uVar12 = uVar12 % 0xfff1;
        uVar22 = uVar22 - uVar10;
        uVar10 = 0x15b0;
      } while (uVar22 != 0);
    }
    uVar15 = uVar12 << 0x10 | uVar15;
    r->m_check_adler32 = uVar15;
    if ((cVar32 != '\0') && (local_134 = TINFL_STATUS_DONE, (decomp_flags & 1) != 0)) {
      local_134 = (uint)(uVar15 == r->m_z_adler32) * 2 + TINFL_STATUS_ADLER32_MISMATCH;
    }
  }
  return local_134;
code_r0x00119222:
  if (local_128 < 0x1e) {
    local_f8 = local_f8 | (ulong)*local_108 << (bVar8 & 0x3f);
    local_108 = local_108 + 1;
    local_128 = local_128 | 0x20;
  }
  uVar12 = (uint)r->m_tables[0].m_look_up[(uint)local_f8 & 0x3ff];
  uVar10 = (ulong)uVar12;
  if ((int)uVar12 < 0) {
    uVar33 = 10;
    do {
      uVar12 = (int)uVar33 + 1;
      uVar15 = (uint)r->m_tables[0].m_tree
                     [(long)(int)~(uint)uVar10 + (ulong)((local_f8 >> (uVar33 & 0x3f) & 1) != 0)];
      uVar10 = (ulong)uVar15;
      uVar33 = (ulong)uVar12;
    } while ((int)uVar15 < 0);
  }
  else {
    uVar12 = uVar12 >> 9;
  }
  local_f8 = local_f8 >> ((byte)uVar12 & 0x3f);
  local_128 = local_128 - uVar12;
  if (((uint)uVar10 >> 8 & 1) == 0) {
    sVar4 = r->m_tables[0].m_look_up[(uint)local_f8 & 0x3ff];
    uVar12 = (uint)sVar4;
    if (sVar4 < 0) {
      uVar33 = 10;
      do {
        uVar15 = (int)uVar33 + 1;
        sVar4 = r->m_tables[0].m_tree
                [(long)(int)~uVar12 + (ulong)((local_f8 >> (uVar33 & 0x3f) & 1) != 0)];
        uVar12 = (uint)sVar4;
        uVar33 = (ulong)uVar15;
      } while (sVar4 < 0);
    }
    else {
      uVar15 = uVar12 >> 9;
    }
    local_f8 = local_f8 >> ((byte)uVar15 & 0x3f);
    local_128 = local_128 - uVar15;
    *pmVar35 = (mz_uint8)uVar10;
    if ((uVar12 >> 8 & 1) == 0) {
      pmVar35[1] = (mz_uint8)uVar12;
      pmVar35 = pmVar35 + 2;
      bVar36 = true;
    }
    else {
      pmVar35 = pmVar35 + 1;
      bVar36 = false;
      uVar10 = (ulong)uVar12;
    }
  }
  else {
    bVar36 = false;
  }
  uVar12 = (uint)uVar10;
  if (!bVar36) {
LAB_00119401:
    uVar10 = 0x100;
    if ((uVar12 & 0x1ff) != 0x100) {
      uVar33 = (ulong)((uVar12 & 0x1ff) - 0x101);
      uVar10 = (ulong)(uint)tinfl_decompress::s_length_base[uVar33];
      local_114 = 0;
      if (0xffffffffffffffeb < uVar33 - 0x1c) {
        local_114 = tinfl_decompress::s_length_extra[uVar33];
        uVar33 = local_f8;
        for (; local_128 < local_114; local_128 = local_128 + 8) {
          local_f8 = uVar33;
          if (local_108 < puVar1) {
LAB_00118263:
            uVar23 = (ulong)(byte)*local_108;
            local_108 = (uint *)((long)local_108 + 1);
          }
          else {
LAB_0011888f:
            uVar15 = (uint)local_100;
            uVar30 = (uint)uVar10;
            uVar23 = 0;
            uVar33 = 0;
            if ((decomp_flags & 2) != 0) {
              local_134 = TINFL_STATUS_NEEDS_MORE_INPUT;
              uVar12 = 0x19;
              cVar7 = '\x01';
              goto LAB_001185e6;
            }
          }
          uVar33 = local_f8 | uVar23 << ((byte)local_128 & 0x3f);
        }
        local_f8 = uVar33 >> ((byte)local_114 & 0x3f);
        local_128 = local_128 - local_114;
        uVar10 = (ulong)(((uint)uVar33 & ~(-1 << ((byte)local_114 & 0x1f))) + (int)uVar10);
      }
      if (local_128 < 0xf) {
        if ((long)puVar1 - (long)local_108 < 2) {
          do {
            uVar3 = r->m_tables[1].m_look_up[(uint)local_f8 & 0x3ff];
            uVar12 = (uint)(short)uVar3;
            if ((short)uVar3 < 0) {
              if (10 < local_128) {
                uVar15 = 0xc;
                do {
                  sVar4 = r->m_tables[1].m_tree
                          [(long)(int)~uVar12 +
                           (ulong)((local_f8 >> ((ulong)(uVar15 - 2) & 0x3f) & 1) != 0)];
                  uVar12 = (uint)sVar4;
                  if (-1 < sVar4) break;
                  bVar36 = uVar15 <= local_128;
                  uVar15 = uVar15 + 1;
                } while (bVar36);
                if (-1 < sVar4) break;
              }
            }
            else if ((0x1ff < uVar3) && (uVar12 >> 9 <= local_128)) break;
            if (local_108 < puVar1) {
LAB_001181c8:
              uVar23 = (ulong)(byte)*local_108;
              local_108 = (uint *)((long)local_108 + 1);
            }
            else {
LAB_00119637:
              uVar15 = (uint)local_100;
              uVar30 = (uint)uVar10;
              uVar23 = 0;
              uVar33 = 0;
              if ((decomp_flags & 2) != 0) {
                local_134 = TINFL_STATUS_NEEDS_MORE_INPUT;
                uVar12 = 0x1a;
                cVar7 = '\x01';
                goto LAB_001185e6;
              }
            }
            local_f8 = local_f8 | uVar23 << ((byte)local_128 & 0x3f);
            local_128 = local_128 + 8;
          } while (local_128 < 0xf);
        }
        else {
          local_f8 = local_f8 |
                     (ulong)*(byte *)((long)local_108 + 1) << ((byte)local_128 + 8 & 0x3f) |
                     (ulong)(byte)*local_108 << ((byte)local_128 & 0x3f);
          local_108 = (uint *)((long)local_108 + 2);
          local_128 = local_128 | 0x10;
        }
      }
      sVar4 = r->m_tables[1].m_look_up[(uint)local_f8 & 0x3ff];
      uVar12 = (uint)sVar4;
      if (sVar4 < 0) {
        uVar33 = 10;
        do {
          uVar15 = (int)uVar33 + 1;
          sVar4 = r->m_tables[1].m_tree
                  [(long)(int)~uVar12 + (ulong)((local_f8 >> (uVar33 & 0x3f) & 1) != 0)];
          uVar12 = (uint)sVar4;
          uVar33 = (ulong)uVar15;
        } while (sVar4 < 0);
      }
      else {
        uVar15 = uVar12 >> 9;
        uVar12 = uVar12 & 0x1ff;
      }
      local_f8 = local_f8 >> ((byte)uVar15 & 0x3f);
      local_128 = local_128 - uVar15;
      uVar33 = (ulong)uVar12;
      local_100 = (ulong)(uint)tinfl_decompress::s_dist_base[uVar33];
      local_114 = 0;
      if (0xffffffffffffffe5 < uVar33 - 0x1e) {
        local_114 = tinfl_decompress::s_dist_extra[uVar33];
        uVar33 = local_f8;
        for (; local_128 < local_114; local_128 = local_128 + 8) {
          local_f8 = uVar33;
          if (local_108 < puVar1) {
LAB_001182df:
            uVar23 = (ulong)(byte)*local_108;
            local_108 = (uint *)((long)local_108 + 1);
          }
          else {
LAB_001196f0:
            uVar15 = (uint)local_100;
            uVar30 = (uint)uVar10;
            uVar23 = 0;
            uVar33 = 0;
            if ((decomp_flags & 2) != 0) {
              local_134 = TINFL_STATUS_NEEDS_MORE_INPUT;
              uVar12 = 0x1b;
              cVar7 = '\x01';
              goto LAB_001185e6;
            }
          }
          uVar33 = local_f8 | uVar23 << ((byte)local_128 & 0x3f);
        }
        local_f8 = uVar33 >> ((byte)local_114 & 0x3f);
        local_128 = local_128 - local_114;
        local_100 = (ulong)(((uint)uVar33 & ~(-1 << ((byte)local_114 & 0x1f))) + (int)local_100);
      }
      local_134 = TINFL_STATUS_FAILED;
      uVar30 = (uint)uVar10;
      local_130 = (long)pmVar35 - (long)pOut_buf_start;
      if (((decomp_flags & 4) != 0) && (local_130 < local_100)) {
        uVar10 = 0;
        uVar12 = 0x25;
        goto LAB_00118bac;
      }
      pmVar11 = pOut_buf_start + (local_130 - local_100 & uVar22);
      pmVar14 = pmVar11;
      if (pmVar11 < pmVar35) {
        pmVar14 = pmVar35;
      }
      if (pmVar13 < pmVar14 + uVar10) {
        while (iVar16 = (int)uVar10, uVar10 = (ulong)(iVar16 - 1), sVar31 = local_130, iVar16 != 0)
        {
LAB_00119807:
          uVar30 = (uint)uVar10;
          if (pmVar13 <= pmVar35) {
            local_134 = TINFL_STATUS_HAS_MORE_OUTPUT;
            uVar10 = 1;
            uVar12 = 0x35;
            local_130 = sVar31;
            goto LAB_00118bac;
          }
          local_130 = sVar31 + 1;
          *pmVar35 = pOut_buf_start[sVar31 - local_100 & uVar22];
          pmVar35 = pmVar35 + 1;
        }
      }
      else {
        uVar10 = (ulong)(uVar30 - 3) + 3;
        do {
          pmVar34 = pmVar35;
          pmVar14 = pmVar11;
          *pmVar34 = *pmVar14;
          pmVar34[1] = pmVar14[1];
          pmVar34[2] = pmVar14[2];
          pmVar35 = pmVar34 + 3;
          uVar10 = uVar10 - 3;
          iVar16 = (int)uVar10;
          pmVar11 = pmVar14 + 3;
        } while (2 < iVar16);
        if (0 < iVar16) {
          *pmVar35 = pmVar14[3];
          if (iVar16 == 2) {
            pmVar34[4] = pmVar14[4];
          }
          pmVar35 = pmVar35 + uVar10;
        }
      }
      goto LAB_00119200;
    }
    goto LAB_00119414;
  }
  goto LAB_00119200;
}

Assistant:

static tinfl_status tinfl_decompress(tinfl_decompressor *r, const mz_uint8 *pIn_buf_next, size_t *pIn_buf_size, mz_uint8 *pOut_buf_start, mz_uint8 *pOut_buf_next, size_t *pOut_buf_size, const mz_uint32 decomp_flags)
{
  static const int s_length_base[31] = { 3,4,5,6,7,8,9,10,11,13, 15,17,19,23,27,31,35,43,51,59, 67,83,99,115,131,163,195,227,258,0,0 };
  static const int s_length_extra[31]= { 0,0,0,0,0,0,0,0,1,1,1,1,2,2,2,2,3,3,3,3,4,4,4,4,5,5,5,5,0,0,0 };
  static const int s_dist_base[32] = { 1,2,3,4,5,7,9,13,17,25,33,49,65,97,129,193, 257,385,513,769,1025,1537,2049,3073,4097,6145,8193,12289,16385,24577,0,0};
  static const int s_dist_extra[32] = { 0,0,0,0,1,1,2,2,3,3,4,4,5,5,6,6,7,7,8,8,9,9,10,10,11,11,12,12,13,13};
  static const mz_uint8 s_length_dezigzag[19] = { 16,17,18,0,8,7,9,6,10,5,11,4,12,3,13,2,14,1,15 };
  static const int s_min_table_sizes[3] = { 257, 1, 4 };

  tinfl_status status = TINFL_STATUS_FAILED; mz_uint32 num_bits, dist, counter, num_extra; tinfl_bit_buf_t bit_buf;
  const mz_uint8 *pIn_buf_cur = pIn_buf_next, *const pIn_buf_end = pIn_buf_next + *pIn_buf_size;
  mz_uint8 *pOut_buf_cur = pOut_buf_next, *const pOut_buf_end = pOut_buf_next + *pOut_buf_size;
  size_t out_buf_size_mask = (decomp_flags & TINFL_FLAG_USING_NON_WRAPPING_OUTPUT_BUF) ? (size_t)-1 : ((pOut_buf_next - pOut_buf_start) + *pOut_buf_size) - 1, dist_from_out_buf_start;

  /* Ensure the output buffer's size is a power of 2, unless the output buffer is large enough to hold the entire output file (in which case it doesn't matter). */
  if (((out_buf_size_mask + 1) & out_buf_size_mask) || (pOut_buf_next < pOut_buf_start)) { *pIn_buf_size = *pOut_buf_size = 0; return TINFL_STATUS_BAD_PARAM; }

  num_bits = r->m_num_bits; bit_buf = r->m_bit_buf; dist = r->m_dist; counter = r->m_counter; num_extra = r->m_num_extra; dist_from_out_buf_start = r->m_dist_from_out_buf_start;
  TINFL_CR_BEGIN

  bit_buf = num_bits = dist = counter = num_extra = r->m_zhdr0 = r->m_zhdr1 = 0; r->m_z_adler32 = r->m_check_adler32 = 1;
  if (decomp_flags & TINFL_FLAG_PARSE_ZLIB_HEADER)
  {
    TINFL_GET_BYTE(1, r->m_zhdr0); TINFL_GET_BYTE(2, r->m_zhdr1);
    counter = (((r->m_zhdr0 * 256 + r->m_zhdr1) % 31 != 0) || (r->m_zhdr1 & 32) || ((r->m_zhdr0 & 15) != 8));
    if (!(decomp_flags & TINFL_FLAG_USING_NON_WRAPPING_OUTPUT_BUF)) counter |= (((1U << (8U + (r->m_zhdr0 >> 4))) > 32768U) || ((out_buf_size_mask + 1) < (size_t)(1U << (8U + (r->m_zhdr0 >> 4)))));
    if (counter) { TINFL_CR_RETURN_FOREVER(36, TINFL_STATUS_FAILED); }
  }

  do
  {
    TINFL_GET_BITS(3, r->m_final, 3); r->m_type = r->m_final >> 1;
    if (r->m_type == 0)
    {
      TINFL_SKIP_BITS(5, num_bits & 7);
      for (counter = 0; counter < 4; ++counter) { if (num_bits) TINFL_GET_BITS(6, r->m_raw_header[counter], 8); else TINFL_GET_BYTE(7, r->m_raw_header[counter]); }
      if ((counter = (r->m_raw_header[0] | (r->m_raw_header[1] << 8))) != (mz_uint)(0xFFFF ^ (r->m_raw_header[2] | (r->m_raw_header[3] << 8)))) { TINFL_CR_RETURN_FOREVER(39, TINFL_STATUS_FAILED); }
      while ((counter) && (num_bits))
      {
        TINFL_GET_BITS(51, dist, 8);
        while (pOut_buf_cur >= pOut_buf_end) { TINFL_CR_RETURN(52, TINFL_STATUS_HAS_MORE_OUTPUT); }
        *pOut_buf_cur++ = (mz_uint8)dist;
        counter--;
      }
      while (counter)
      {
        size_t n; while (pOut_buf_cur >= pOut_buf_end) { TINFL_CR_RETURN(9, TINFL_STATUS_HAS_MORE_OUTPUT); }
        while (pIn_buf_cur >= pIn_buf_end)
        {
          if (decomp_flags & TINFL_FLAG_HAS_MORE_INPUT)
          {
            TINFL_CR_RETURN(38, TINFL_STATUS_NEEDS_MORE_INPUT);
          }
          else
          {
            TINFL_CR_RETURN_FOREVER(40, TINFL_STATUS_FAILED);
          }
        }
        n = MZ_MIN(MZ_MIN((size_t)(pOut_buf_end - pOut_buf_cur), (size_t)(pIn_buf_end - pIn_buf_cur)), counter);
        TINFL_MEMCPY(pOut_buf_cur, pIn_buf_cur, n); pIn_buf_cur += n; pOut_buf_cur += n; counter -= (mz_uint)n;
      }
    }
    else if (r->m_type == 3)
    {
      TINFL_CR_RETURN_FOREVER(10, TINFL_STATUS_FAILED);
    }
    else
    {
      if (r->m_type == 1)
      {
        mz_uint8 *p = r->m_tables[0].m_code_size; mz_uint i;
        r->m_table_sizes[0] = 288; r->m_table_sizes[1] = 32; TINFL_MEMSET(r->m_tables[1].m_code_size, 5, 32);
        for ( i = 0; i <= 143; ++i) *p++ = 8;
        for ( ; i <= 255; ++i) *p++ = 9;
        for ( ; i <= 279; ++i) *p++ = 7;
        for ( ; i <= 287; ++i) *p++ = 8;
      }
      else
      {
        for (counter = 0; counter < 3; counter++) { TINFL_GET_BITS(11, r->m_table_sizes[counter], "\05\05\04"[counter]); r->m_table_sizes[counter] += s_min_table_sizes[counter]; }
        MZ_CLEAR_ARR(r->m_tables[2].m_code_size); for (counter = 0; counter < r->m_table_sizes[2]; counter++) { mz_uint s; TINFL_GET_BITS(14, s, 3); r->m_tables[2].m_code_size[s_length_dezigzag[counter]] = (mz_uint8)s; }
        r->m_table_sizes[2] = 19;
      }
      for ( ; (int)r->m_type >= 0; r->m_type--)
      {
        int tree_next, tree_cur; tinfl_huff_table *pTable;
        mz_uint i, j, used_syms, total, sym_index, next_code[17], total_syms[16]; pTable = &r->m_tables[r->m_type]; MZ_CLEAR_ARR(total_syms); MZ_CLEAR_ARR(pTable->m_look_up); MZ_CLEAR_ARR(pTable->m_tree);
        for (i = 0; i < r->m_table_sizes[r->m_type]; ++i) total_syms[pTable->m_code_size[i]]++;
        used_syms = 0, total = 0; next_code[0] = next_code[1] = 0;
        for (i = 1; i <= 15; ++i) { used_syms += total_syms[i]; next_code[i + 1] = (total = ((total + total_syms[i]) << 1)); }
        if ((65536 != total) && (used_syms > 1))
        {
          TINFL_CR_RETURN_FOREVER(35, TINFL_STATUS_FAILED);
        }
        for (tree_next = -1, sym_index = 0; sym_index < r->m_table_sizes[r->m_type]; ++sym_index)
        {
          mz_uint rev_code = 0, l, cur_code, code_size = pTable->m_code_size[sym_index]; if (!code_size) continue;
          cur_code = next_code[code_size]++; for (l = code_size; l > 0; l--, cur_code >>= 1) rev_code = (rev_code << 1) | (cur_code & 1);
          if (code_size <= TINFL_FAST_LOOKUP_BITS) { mz_int16 k = (mz_int16)((code_size << 9) | sym_index); while (rev_code < TINFL_FAST_LOOKUP_SIZE) { pTable->m_look_up[rev_code] = k; rev_code += (1 << code_size); } continue; }
          if (0 == (tree_cur = pTable->m_look_up[rev_code & (TINFL_FAST_LOOKUP_SIZE - 1)])) { pTable->m_look_up[rev_code & (TINFL_FAST_LOOKUP_SIZE - 1)] = (mz_int16)tree_next; tree_cur = tree_next; tree_next -= 2; }
          rev_code >>= (TINFL_FAST_LOOKUP_BITS - 1);
          for (j = code_size; j > (TINFL_FAST_LOOKUP_BITS + 1); j--)
          {
            tree_cur -= ((rev_code >>= 1) & 1);
            if (!pTable->m_tree[-tree_cur - 1]) { pTable->m_tree[-tree_cur - 1] = (mz_int16)tree_next; tree_cur = tree_next; tree_next -= 2; } else tree_cur = pTable->m_tree[-tree_cur - 1];
          }
          tree_cur -= ((rev_code >>= 1) & 1); pTable->m_tree[-tree_cur - 1] = (mz_int16)sym_index;
        }
        if (r->m_type == 2)
        {
          for (counter = 0; counter < (r->m_table_sizes[0] + r->m_table_sizes[1]); )
          {
            mz_uint s; TINFL_HUFF_DECODE(16, dist, &r->m_tables[2]); if (dist < 16) { r->m_len_codes[counter++] = (mz_uint8)dist; continue; }
            if ((dist == 16) && (!counter))
            {
              TINFL_CR_RETURN_FOREVER(17, TINFL_STATUS_FAILED);
            }
            num_extra = "\02\03\07"[dist - 16]; TINFL_GET_BITS(18, s, num_extra); s += "\03\03\013"[dist - 16];
            TINFL_MEMSET(r->m_len_codes + counter, (dist == 16) ? r->m_len_codes[counter - 1] : 0, s); counter += s;
          }
          if ((r->m_table_sizes[0] + r->m_table_sizes[1]) != counter)
          {
            TINFL_CR_RETURN_FOREVER(21, TINFL_STATUS_FAILED);
          }
          TINFL_MEMCPY(r->m_tables[0].m_code_size, r->m_len_codes, r->m_table_sizes[0]); TINFL_MEMCPY(r->m_tables[1].m_code_size, r->m_len_codes + r->m_table_sizes[0], r->m_table_sizes[1]);
        }
      }
      for ( ; ; )
      {
        mz_uint8 *pSrc;
        for ( ; ; )
        {
          if (((pIn_buf_end - pIn_buf_cur) < 4) || ((pOut_buf_end - pOut_buf_cur) < 2))
          {
            TINFL_HUFF_DECODE(23, counter, &r->m_tables[0]);
            if (counter >= 256)
              break;
            while (pOut_buf_cur >= pOut_buf_end) { TINFL_CR_RETURN(24, TINFL_STATUS_HAS_MORE_OUTPUT); }
            *pOut_buf_cur++ = (mz_uint8)counter;
          }
          else
          {
            int sym2; mz_uint code_len;
#if TINFL_USE_64BIT_BITBUF
            if (num_bits < 30) { bit_buf |= (((tinfl_bit_buf_t)MZ_READ_LE32(pIn_buf_cur)) << num_bits); pIn_buf_cur += 4; num_bits += 32; }
#else
            if (num_bits < 15) { bit_buf |= (((tinfl_bit_buf_t)MZ_READ_LE16(pIn_buf_cur)) << num_bits); pIn_buf_cur += 2; num_bits += 16; }
#endif
            if ((sym2 = r->m_tables[0].m_look_up[bit_buf & (TINFL_FAST_LOOKUP_SIZE - 1)]) >= 0)
              code_len = sym2 >> 9;
            else
            {
              code_len = TINFL_FAST_LOOKUP_BITS; do { sym2 = r->m_tables[0].m_tree[~sym2 + ((bit_buf >> code_len++) & 1)]; } while (sym2 < 0);
            }
            counter = sym2; bit_buf >>= code_len; num_bits -= code_len;
            if (counter & 256)
              break;

#if !TINFL_USE_64BIT_BITBUF
            if (num_bits < 15) { bit_buf |= (((tinfl_bit_buf_t)MZ_READ_LE16(pIn_buf_cur)) << num_bits); pIn_buf_cur += 2; num_bits += 16; }
#endif
            if ((sym2 = r->m_tables[0].m_look_up[bit_buf & (TINFL_FAST_LOOKUP_SIZE - 1)]) >= 0)
              code_len = sym2 >> 9;
            else
            {
              code_len = TINFL_FAST_LOOKUP_BITS; do { sym2 = r->m_tables[0].m_tree[~sym2 + ((bit_buf >> code_len++) & 1)]; } while (sym2 < 0);
            }
            bit_buf >>= code_len; num_bits -= code_len;

            pOut_buf_cur[0] = (mz_uint8)counter;
            if (sym2 & 256)
            {
              pOut_buf_cur++;
              counter = sym2;
              break;
            }
            pOut_buf_cur[1] = (mz_uint8)sym2;
            pOut_buf_cur += 2;
          }
        }
        if ((counter &= 511) == 256) break;

        num_extra = s_length_extra[counter - 257]; counter = s_length_base[counter - 257];
        if (num_extra) { mz_uint extra_bits; TINFL_GET_BITS(25, extra_bits, num_extra); counter += extra_bits; }

        TINFL_HUFF_DECODE(26, dist, &r->m_tables[1]);
        num_extra = s_dist_extra[dist]; dist = s_dist_base[dist];
        if (num_extra) { mz_uint extra_bits; TINFL_GET_BITS(27, extra_bits, num_extra); dist += extra_bits; }

        dist_from_out_buf_start = pOut_buf_cur - pOut_buf_start;
        if ((dist > dist_from_out_buf_start) && (decomp_flags & TINFL_FLAG_USING_NON_WRAPPING_OUTPUT_BUF))
        {
          TINFL_CR_RETURN_FOREVER(37, TINFL_STATUS_FAILED);
        }

        pSrc = pOut_buf_start + ((dist_from_out_buf_start - dist) & out_buf_size_mask);

        if ((MZ_MAX(pOut_buf_cur, pSrc) + counter) > pOut_buf_end)
        {
          while (counter--)
          {
            while (pOut_buf_cur >= pOut_buf_end) { TINFL_CR_RETURN(53, TINFL_STATUS_HAS_MORE_OUTPUT); }
            *pOut_buf_cur++ = pOut_buf_start[(dist_from_out_buf_start++ - dist) & out_buf_size_mask];
          }
          continue;
        }
#if MINIZ_USE_UNALIGNED_LOADS_AND_STORES
        else if ((counter >= 9) && (counter <= dist))
        {
          const mz_uint8 *pSrc_end = pSrc + (counter & ~7);
          do
          {
            ((mz_uint32 *)pOut_buf_cur)[0] = ((const mz_uint32 *)pSrc)[0];
            ((mz_uint32 *)pOut_buf_cur)[1] = ((const mz_uint32 *)pSrc)[1];
            pOut_buf_cur += 8;
          } while ((pSrc += 8) < pSrc_end);
          if ((counter &= 7) < 3)
          {
            if (counter)
            {
              pOut_buf_cur[0] = pSrc[0];
              if (counter > 1)
                pOut_buf_cur[1] = pSrc[1];
              pOut_buf_cur += counter;
            }
            continue;
          }
        }
#endif
        do
        {
          pOut_buf_cur[0] = pSrc[0];
          pOut_buf_cur[1] = pSrc[1];
          pOut_buf_cur[2] = pSrc[2];
          pOut_buf_cur += 3; pSrc += 3;
        } while ((int)(counter -= 3) > 2);
        if ((int)counter > 0)
        {
          pOut_buf_cur[0] = pSrc[0];
          if ((int)counter > 1)
            pOut_buf_cur[1] = pSrc[1];
          pOut_buf_cur += counter;
        }
      }
    }
  } while (!(r->m_final & 1));
  if (decomp_flags & TINFL_FLAG_PARSE_ZLIB_HEADER)
  {
    TINFL_SKIP_BITS(32, num_bits & 7); for (counter = 0; counter < 4; ++counter) { mz_uint s; if (num_bits) TINFL_GET_BITS(41, s, 8); else TINFL_GET_BYTE(42, s); r->m_z_adler32 = (r->m_z_adler32 << 8) | s; }
  }
  TINFL_CR_RETURN_FOREVER(34, TINFL_STATUS_DONE);
  TINFL_CR_FINISH

common_exit:
  r->m_num_bits = num_bits; r->m_bit_buf = bit_buf; r->m_dist = dist; r->m_counter = counter; r->m_num_extra = num_extra; r->m_dist_from_out_buf_start = dist_from_out_buf_start;
  *pIn_buf_size = pIn_buf_cur - pIn_buf_next; *pOut_buf_size = pOut_buf_cur - pOut_buf_next;
  if ((decomp_flags & (TINFL_FLAG_PARSE_ZLIB_HEADER | TINFL_FLAG_COMPUTE_ADLER32)) && (status >= 0))
  {
    const mz_uint8 *ptr = pOut_buf_next; size_t buf_len = *pOut_buf_size;
    mz_uint32 i, s1 = r->m_check_adler32 & 0xffff, s2 = r->m_check_adler32 >> 16; size_t block_len = buf_len % 5552;
    while (buf_len)
    {
      for (i = 0; i + 7 < block_len; i += 8, ptr += 8)
      {
        s1 += ptr[0], s2 += s1; s1 += ptr[1], s2 += s1; s1 += ptr[2], s2 += s1; s1 += ptr[3], s2 += s1;
        s1 += ptr[4], s2 += s1; s1 += ptr[5], s2 += s1; s1 += ptr[6], s2 += s1; s1 += ptr[7], s2 += s1;
      }
      for ( ; i < block_len; ++i) s1 += *ptr++, s2 += s1;
      s1 %= 65521U, s2 %= 65521U; buf_len -= block_len; block_len = 5552;
    }
    r->m_check_adler32 = (s2 << 16) + s1; if ((status == TINFL_STATUS_DONE) && (decomp_flags & TINFL_FLAG_PARSE_ZLIB_HEADER) && (r->m_check_adler32 != r->m_z_adler32)) status = TINFL_STATUS_ADLER32_MISMATCH;
  }
  return status;
}